

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pa_front.c
# Opt level: O0

PaDeviceIndex Pa_GetDefaultInputDevice(void)

{
  PaDeviceIndex PVar1;
  PaHostApiIndex PVar2;
  PaDeviceIndex result;
  PaHostApiIndex hostApi;
  
  PVar2 = Pa_GetDefaultHostApi();
  if (PVar2 < 0) {
    PVar1 = -1;
  }
  else {
    PVar1 = (hostApis_[PVar2]->info).defaultInputDevice;
  }
  return PVar1;
}

Assistant:

PaDeviceIndex Pa_GetDefaultInputDevice( void )
{
    PaHostApiIndex hostApi;
    PaDeviceIndex result;

    PA_LOGAPI_ENTER( "Pa_GetDefaultInputDevice" );

    hostApi = Pa_GetDefaultHostApi();
    if( hostApi < 0 )
    {
        result = paNoDevice;
    }
    else
    {
        result = hostApis_[hostApi]->info.defaultInputDevice;
    }

    PA_LOGAPI_EXIT_T( "Pa_GetDefaultInputDevice", "PaDeviceIndex: %d", result );

    return result;
}